

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

bool Internal_UseHatchReadV5(ON_BinaryArchive *archive)

{
  int iVar1;
  uint uVar2;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  ON__UINT32 local_24;
  ON__INT64 local_20;
  
  iVar1 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar1 < 0x3c) {
    return true;
  }
  iVar1 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar1 < 0x3d) {
    uVar2 = ON_BinaryArchive::ArchiveOpenNURBSVersion(archive);
    if (uVar2 < 0x8c005ca4) {
      return true;
    }
    if (uVar2 < 0x8c005ca8) {
      local_24 = 0;
      local_20 = 0;
      ON_BinaryArchive::PeekAt3dmBigChunkType(archive,&local_24,&local_20);
      return local_24 != 0x40008000;
    }
  }
  return false;
}

Assistant:

static bool Internal_UseHatchReadV5(
  ON_BinaryArchive& archive
  )
{
  if (archive.Archive3dmVersion() < 60)
    return true;
  if (archive.Archive3dmVersion() > 60)
    return false;
  
  // There are 4 possible Feb 26 version numbers depending on the build system
  // archive.Archive3dmVersion() % 4 = (0=developer,1=windows build system,2 = mac build system, 3=unused)
  const unsigned int Feb_26_2016_opennurbs_version_number0 = 2348833956;
  const unsigned int Feb_26_2016_opennurbs_version_number3 = 2348833956+3; 

  const unsigned int archive_opennurbs_version_number = archive.ArchiveOpenNURBSVersion();

  if (archive_opennurbs_version_number < Feb_26_2016_opennurbs_version_number0)
    return true; // "old" opennurbs hatch code

  if (  archive_opennurbs_version_number >= Feb_26_2016_opennurbs_version_number0
    && archive_opennurbs_version_number <= Feb_26_2016_opennurbs_version_number3
    )
  {
    // new hatch IO code pushed to master branch on Feb 26, 2016.
    // THis clunky test has to be used on files written with the Feb 26, 2016 version of opennurbs source code.
    ON__UINT32 tcode = 0;
    ON__INT64 big_value = 0;
    archive.PeekAt3dmBigChunkType(&tcode, &big_value);
    if (TCODE_ANONYMOUS_CHUNK == tcode)
      return false; // use "new" IO
    return true; // use "old" IO
  }

  // 6.0 or later file created with executable using opennurbs code on Feb 27, 2016 or later
  return false;
}